

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexutils.cpp
# Opt level: O2

bool QHexUtils::PatternUtils::match(QByteArray *data,QString *pattern)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  QStringView *this;
  qint64 i;
  long pos;
  qint64 idx;
  long lVar4;
  QStringView lhs;
  QStringView rhs;
  bool ok;
  char16_t *local_48;
  QStringView hexb;
  
  lVar4 = 0;
  pos = 0;
  while( true ) {
    _ok = (pattern->d).size;
    lVar1 = _ok - 2;
    if (lVar1 < pos) {
      return lVar1 < pos;
    }
    if ((data->d).size <= lVar4) break;
    local_48 = (pattern->d).ptr;
    this = (QStringView *)&ok;
    lhs = QStringView::mid((QStringView *)&ok,pos,2);
    hexb = lhs;
    _GLOBAL__N_1::
    QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
    ::operator*((QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
                 *)this);
    rhs.m_data = (storage_type_conflict *)
                 (anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction()::holder._8_8_;
    rhs.m_size = (anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction()::holder._16_8_;
    bVar2 = operator==(lhs,rhs);
    if (!bVar2) {
      _ok = _ok & 0xffffffffffffff00;
      uVar3 = QStringView::toUInt(&hexb,&ok,0x10);
      if ((ok != true) || ((char)uVar3 != (data->d).ptr[lVar4])) {
        return false;
      }
    }
    pos = pos + 2;
    lVar4 = lVar4 + 1;
  }
  return lVar1 < pos;
}

Assistant:

bool match(const QByteArray& data, const QString& pattern) {
    for(qint64 i = 0, idx = 0; (i <= (pattern.size() - 2)); i += 2, idx++) {
        if(idx >= data.size())
            return false;

#if QT_VERSION >= QT_VERSION_CHECK(6, 0, 0)
        QStringView hexb = QStringView{pattern}.mid(i, 2);
#else
        const QStringRef& hexb = pattern.midRef(i, 2);
#endif

        if(hexb == *WILDCARD_BYTE)
            continue;

        bool ok = false;
        auto b = static_cast<char>(hexb.toUInt(&ok, 16));
        if(!ok || (b != data.at(idx)))
            return false;
    }

    return true;
}